

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::computeDualActivity
          (SPxLPBase<double> *this,VectorBase<double> *dual,VectorBase<double> *activity,
          bool unscaled)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  Nonzero<double> *pNVar5;
  VectorBase<double> *pVVar6;
  pointer pdVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  iterator __end0;
  uint uVar14;
  ulong uVar15;
  vector<double,_std::allocator<double>_> *__range2;
  Item *pIVar16;
  undefined **local_58;
  Nonzero<double> *local_50;
  undefined8 uStack_48;
  Nonzero<double> *local_40;
  VectorBase<double> *local_38;
  
  pdVar3 = (dual->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (uint)((ulong)((long)(dual->val).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
  if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum != uVar9) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_58 = (undefined **)&uStack_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "XSPXLP02 Dual vector for computing dual activity has wrong dimension","");
    *puVar8 = &PTR__SPxException_0069d438;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar8 + 1),local_58,(long)local_50 + (long)local_58);
    *puVar8 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  pdVar7 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (long)pdVar4 - (long)pdVar7;
  uVar14 = (uint)(uVar10 >> 3);
  if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum == uVar14) {
    if (0 < (int)uVar9) {
      uVar15 = 0;
      do {
        dVar1 = pdVar3[uVar15];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          local_50 = (Nonzero<double> *)0x0;
          uStack_48 = (undefined *)0x0;
          local_58 = &PTR__DSVectorBase_0069e2b8;
          local_40 = (Nonzero<double> *)0x0;
          uVar9 = 2;
          if (0 < (int)uVar14) {
            uVar9 = uVar14;
          }
          local_38 = dual;
          spx_alloc<soplex::Nonzero<double>*>(&local_40,uVar9);
          local_50 = local_40;
          uStack_48 = (undefined *)(ulong)uVar9;
          if ((unscaled) && (this->_isScaled == true)) {
            (*this->lp_scaler->_vptr_SPxScaler[0x1a])
                      (this->lp_scaler,this,uVar15 & 0xffffffff,&local_58);
            pdVar3 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pdVar3 != pdVar7) {
              memset(pdVar3,0,(long)pdVar7 - (long)pdVar3 & 0xfffffffffffffff8);
            }
            if (0 < (long)uStack_48._4_4_) {
              lVar11 = 0;
              do {
                pdVar3[*(int *)((long)&local_50->idx + lVar11)] =
                     *(double *)((long)&local_50->val + lVar11);
                lVar11 = lVar11 + 0x10;
              } while ((long)uStack_48._4_4_ * 0x10 != lVar11);
            }
          }
          else {
            pIVar16 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                      (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                      [uVar15 & 0xffffffff].idx;
            pdVar3 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pdVar3 != pdVar7) {
              memset(pdVar3,0,(long)pdVar7 - (long)pdVar3 & 0xfffffffffffffff8);
            }
            lVar11 = (long)(pIVar16->data).super_SVectorBase<double>.memused;
            if (0 < lVar11) {
              pNVar5 = (pIVar16->data).super_SVectorBase<double>.m_elem;
              lVar12 = 0;
              do {
                pdVar3[*(int *)((long)&pNVar5->idx + lVar12)] =
                     *(double *)((long)&pNVar5->val + lVar12);
                lVar12 = lVar12 + 0x10;
              } while (lVar11 * 0x10 != lVar12);
            }
          }
          pVVar6 = local_38;
          pdVar7 = (local_38->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = (uint)((ulong)((long)(activity->val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
          if (0 < (int)uVar9) {
            uVar10 = 0;
            do {
              pdVar3[uVar10] = pdVar7[uVar15 & 0xffffffff] * pdVar3[uVar10];
              uVar10 = uVar10 + 1;
            } while ((uVar9 & 0x7fffffff) != uVar10);
          }
          if ((int)uVar15 + 1 <
              (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
            uVar15 = uVar15 + 1;
            do {
              if ((pdVar7[uVar15] != 0.0) || (NAN(pdVar7[uVar15]))) {
                if ((unscaled) && (this->_isScaled == true)) {
                  (*this->lp_scaler->_vptr_SPxScaler[0x1a])
                            (this->lp_scaler,this,uVar15 & 0xffffffff,&local_58);
                  pdVar7 = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  lVar11 = (long)uStack_48._4_4_;
                  if (0 < lVar11) {
                    pdVar3 = (activity->val).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    uVar10 = lVar11 + 1;
                    piVar13 = &local_50[lVar11 + -1].idx;
                    do {
                      pdVar3[*piVar13] =
                           pdVar7[uVar15] * ((Nonzero<double> *)(piVar13 + -2))->val +
                           pdVar3[*piVar13];
                      uVar10 = uVar10 - 1;
                      piVar13 = piVar13 + -4;
                    } while (1 < uVar10);
                  }
                }
                else {
                  pIVar16 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
                  iVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                          [uVar15].idx;
                  lVar11 = (long)pIVar16[iVar2].data.super_SVectorBase<double>.memused;
                  if (0 < lVar11) {
                    pdVar3 = (activity->val).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    uVar10 = lVar11 + 1;
                    piVar13 = &pIVar16[iVar2].data.super_SVectorBase<double>.m_elem[lVar11 + -1].idx
                    ;
                    do {
                      pdVar3[*piVar13] =
                           pdVar7[uVar15] * ((Nonzero<double> *)(piVar13 + -2))->val +
                           pdVar3[*piVar13];
                      uVar10 = uVar10 - 1;
                      piVar13 = piVar13 + -4;
                    } while (1 < uVar10);
                  }
                }
              }
              uVar15 = uVar15 + 1;
            } while ((int)uVar15 <
                     (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
          }
          local_58 = &PTR__DSVectorBase_0069e2b8;
          if (local_40 == (Nonzero<double> *)0x0) {
            return;
          }
          free(local_40);
          return;
        }
        uVar15 = uVar15 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar15);
    }
    if (pdVar7 == pdVar4) {
      return;
    }
    memset(pdVar7,0,(uVar10 - 8 & 0xfffffffffffffff8) + 8);
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_58 = (undefined **)&uStack_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "XSPXLP04 Activity vector computing dual activity has wrong dimension","");
  *puVar8 = &PTR__SPxException_0069d438;
  puVar8[1] = puVar8 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar8 + 1),local_58,(long)local_50 + (long)local_58);
  *puVar8 = &PTR__SPxException_0069d410;
  __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
}

Assistant:

inline
void SPxLPBase<R>::computeDualActivity(const VectorBase<R>& dual, VectorBase<R>& activity,
                                       const bool unscaled) const
{
   if(dual.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP02 Dual vector for computing dual activity has wrong dimension");

   if(activity.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP04 Activity vector computing dual activity has wrong dimension");

   int r;

   for(r = 0; r < nRows() && dual[r] == 0; r++)
      ;

   if(r >= nRows())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nCols());

   if(unscaled && _isScaled)
   {
      lp_scaler->getRowUnscaled(*this, r, tmp);
      activity = tmp;
   }
   else
      activity = rowVector(r);

   activity *= dual[r];
   r++;

   for(; r < nRows(); r++)
   {
      if(dual[r] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getRowUnscaled(*this, r, tmp);
            activity.multAdd(dual[r], tmp);
         }
         else
            activity.multAdd(dual[r], rowVector(r));
      }
   }
}